

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet.c
# Opt level: O1

int uv_inet_pton(int af,char *src,void *dst)

{
  long lVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  char cVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  ushort uVar11;
  bool bVar12;
  uchar tmp [16];
  undefined1 auStack_68 [8];
  long local_60;
  char *local_58;
  uchar *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 *local_38;
  
  if (af == 10) {
    local_48 = 0;
    uStack_40 = 0;
    if (*src == ':') {
      if (src[1] != ':') {
        return -0x16;
      }
      src = src + 1;
    }
    local_50 = (uchar *)0x0;
    local_60 = 0;
    iVar3 = 0;
    uVar4 = 0;
    local_58 = src;
    local_38 = (undefined8 *)dst;
    do {
      uVar11 = (ushort)uVar4;
      pcVar10 = src + 1;
      cVar2 = *src;
      if (cVar2 == '\0') goto LAB_00108b48;
      pvVar6 = memchr("0123456789abcdef",(int)cVar2,0x11);
      iVar5 = 0x1150c0;
      if (pvVar6 == (void *)0x0) {
        iVar5 = 0x1150e0;
        pvVar6 = memchr("0123456789ABCDEF",(int)cVar2,0x11);
      }
      lVar8 = local_60;
      if (pvVar6 == (void *)0x0) {
        cVar7 = '\x01';
        if (cVar2 == '.') {
          if (local_60 < 0xd) {
            lVar1 = local_60 + 4;
            iVar5 = inet_pton4(local_58,(uchar *)((long)&local_48 + local_60));
            local_60 = lVar8;
            if (iVar5 == 0) {
              iVar3 = 0;
              local_60 = lVar1;
            }
            cVar7 = (iVar5 == 0) * '\x02' + '\x01';
          }
        }
        else if (cVar2 == ':') {
          local_58 = pcVar10;
          if (iVar3 == 0) {
            bVar12 = local_50 == (uchar *)0x0;
            if (bVar12) {
              local_50 = (uchar *)((long)&local_48 + local_60);
            }
            cVar7 = bVar12 + '\x01';
            iVar3 = 0;
          }
          else if ((*pcVar10 != '\0') && (local_60 < 0xf)) {
            *(ushort *)((long)&local_48 + local_60) = uVar11 << 8 | uVar11 >> 8;
            local_60 = local_60 + 2;
            cVar7 = '\x02';
            iVar3 = 0;
            uVar4 = 0;
          }
        }
      }
      else {
        uVar4 = (int)pvVar6 - iVar5 | uVar4 << 4;
        cVar7 = (iVar3 < 4) + '\x01';
        iVar3 = iVar3 + 1;
      }
      uVar11 = (ushort)uVar4;
      src = pcVar10;
    } while (cVar7 == '\x02');
    if (cVar7 == '\x03') {
LAB_00108b48:
      if (iVar3 != 0) {
        if (0xe < local_60) {
          return -0x16;
        }
        *(ushort *)((long)&local_48 + local_60) = uVar11 << 8 | uVar11 >> 8;
        local_60 = local_60 + 2;
      }
      lVar8 = local_60;
      if (local_50 != (uchar *)0x0) {
        if (local_60 != 0x10) {
          uVar4 = ((int)auStack_68 + (int)local_60 + 0x20) - (int)local_50;
          lVar8 = 0x10;
          if (0 < (int)uVar4) {
            lVar1 = (ulong)(uVar4 & 0x7fffffff) - 1;
            lVar9 = 0;
            do {
              *(uchar *)((long)&uStack_40 + lVar9 + 7) = local_50[lVar9 + lVar1];
              local_50[lVar9 + lVar1] = '\0';
              lVar9 = lVar9 + -1;
            } while (1 - (ulong)(uVar4 + 1) != lVar9);
          }
        }
        if (local_60 == 0x10) {
          return -0x16;
        }
      }
      iVar3 = -0x16;
      if (lVar8 == 0x10) {
        *local_38 = local_48;
        local_38[1] = uStack_40;
        iVar3 = 0;
      }
    }
    else {
      iVar3 = -0x16;
    }
  }
  else {
    iVar3 = -0x61;
    if (af == 2) {
      iVar3 = inet_pton4(src,(uchar *)dst);
      return iVar3;
    }
  }
  return iVar3;
}

Assistant:

int uv_inet_pton(int af, const char* src, void* dst) {
  switch (af) {
  case AF_INET:
    return (inet_pton4(src, dst));
  case AF_INET6:
    return (inet_pton6(src, dst));
  default:
    return UV_EAFNOSUPPORT;
  }
  /* NOTREACHED */
}